

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O3

int wally_sha256_midstate(uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len)

{
  uchar *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  int iVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  sha256_ctx ctx;
  sha256_ctx local_88;
  
  iVar28 = -2;
  if ((len == 0x20 && bytes_out != (uchar *)0x0) && (bytes_len == 0 || bytes != (uchar *)0x0)) {
    sha256_init(&local_88);
    sha256_update(&local_88,bytes,bytes_len);
    lVar29 = 0;
    do {
      auVar30 = *(undefined1 (*) [16])(local_88.s + lVar29);
      auVar31[1] = 0;
      auVar31[0] = auVar30[8];
      auVar31[2] = auVar30[9];
      auVar31[3] = 0;
      auVar31[4] = auVar30[10];
      auVar31[5] = 0;
      auVar31[6] = auVar30[0xb];
      auVar31[7] = 0;
      auVar31[8] = auVar30[0xc];
      auVar31[9] = 0;
      auVar31[10] = auVar30[0xd];
      auVar31[0xb] = 0;
      auVar31[0xc] = auVar30[0xe];
      auVar31[0xd] = 0;
      auVar31[0xe] = auVar30[0xf];
      auVar31[0xf] = 0;
      auVar31 = pshuflw(auVar31,auVar31,0x1b);
      auVar31 = pshufhw(auVar31,auVar31,0x1b);
      auVar18[0xd] = 0;
      auVar18._0_13_ = auVar30._0_13_;
      auVar18[0xe] = auVar30[7];
      auVar19[0xc] = auVar30[6];
      auVar19._0_12_ = auVar30._0_12_;
      auVar19._13_2_ = auVar18._13_2_;
      auVar20[0xb] = 0;
      auVar20._0_11_ = auVar30._0_11_;
      auVar20._12_3_ = auVar19._12_3_;
      auVar21[10] = auVar30[5];
      auVar21._0_10_ = auVar30._0_10_;
      auVar21._11_4_ = auVar20._11_4_;
      auVar22[9] = 0;
      auVar22._0_9_ = auVar30._0_9_;
      auVar22._10_5_ = auVar21._10_5_;
      auVar23[8] = auVar30[4];
      auVar23._0_8_ = auVar30._0_8_;
      auVar23._9_6_ = auVar22._9_6_;
      auVar25._7_8_ = 0;
      auVar25._0_7_ = auVar23._8_7_;
      auVar26._1_8_ = SUB158(auVar25 << 0x40,7);
      auVar26[0] = auVar30[3];
      auVar26._9_6_ = 0;
      auVar27._1_10_ = SUB1510(auVar26 << 0x30,5);
      auVar27[0] = auVar30[2];
      auVar27._11_4_ = 0;
      auVar24[2] = auVar30[1];
      auVar24._0_2_ = auVar30._0_2_;
      auVar24._3_12_ = SUB1512(auVar27 << 0x20,3);
      auVar30._0_2_ = auVar30._0_2_ & 0xff;
      auVar30._2_13_ = auVar24._2_13_;
      auVar30[0xf] = 0;
      auVar30 = pshuflw(auVar30,auVar30,0x1b);
      auVar30 = pshufhw(auVar30,auVar30,0x1b);
      sVar2 = auVar30._0_2_;
      sVar3 = auVar30._2_2_;
      sVar4 = auVar30._4_2_;
      sVar5 = auVar30._6_2_;
      sVar6 = auVar30._8_2_;
      sVar7 = auVar30._10_2_;
      sVar8 = auVar30._12_2_;
      sVar9 = auVar30._14_2_;
      sVar10 = auVar31._0_2_;
      sVar11 = auVar31._2_2_;
      sVar12 = auVar31._4_2_;
      sVar13 = auVar31._6_2_;
      sVar14 = auVar31._8_2_;
      sVar15 = auVar31._10_2_;
      sVar16 = auVar31._12_2_;
      sVar17 = auVar31._14_2_;
      puVar1 = bytes_out + lVar29 * 4;
      *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar30[0] - (0xff < sVar2);
      puVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar30[2] - (0xff < sVar3);
      puVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar30[4] - (0xff < sVar4);
      puVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar30[6] - (0xff < sVar5);
      puVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar30[8] - (0xff < sVar6);
      puVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar30[10] - (0xff < sVar7);
      puVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar30[0xc] - (0xff < sVar8);
      puVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar30[0xe] - (0xff < sVar9);
      puVar1[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar31[0] - (0xff < sVar10);
      puVar1[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar31[2] - (0xff < sVar11);
      puVar1[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar31[4] - (0xff < sVar12);
      puVar1[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar31[6] - (0xff < sVar13);
      puVar1[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar31[8] - (0xff < sVar14);
      puVar1[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar31[10] - (0xff < sVar15);
      puVar1[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar31[0xc] - (0xff < sVar16);
      puVar1[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar31[0xe] - (0xff < sVar17);
      lVar29 = lVar29 + 4;
    } while (lVar29 != 8);
    local_88.bytes = 0xffffffffffffffff;
    (*_ops.bzero_fn)(&local_88,0x68);
    iVar28 = 0;
  }
  return iVar28;
}

Assistant:

int wally_sha256_midstate(const unsigned char *bytes, size_t bytes_len,
                          unsigned char *bytes_out, size_t len)
{
    struct sha256 sha;
    struct sha256_ctx ctx;
    bool aligned = alignment_ok(bytes_out, sizeof(sha.u.u32));

    if ((!bytes && bytes_len != 0) || !bytes_out || len != SHA256_LEN)
        return WALLY_EINVAL;

    sha256_init(&ctx);
    sha256_update(&ctx, bytes, bytes_len);
    sha256_midstate(&ctx, aligned ? (struct sha256 *)bytes_out : &sha);
    wally_clear(&ctx, sizeof(ctx));

    if (!aligned) {
        memcpy(bytes_out, &sha, sizeof(sha));
        wally_clear(&sha, sizeof(sha));
    }
    return WALLY_OK;
}